

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void md5_str(MD5_DIGEST digest,char *str,size_t max_len)

{
  long lVar1;
  long in_FS_OFFSET;
  MD5_DIGEST digest_local;
  
  digest_local.data._8_8_ = digest.data._8_8_;
  digest_local.data._0_8_ = digest.data._0_8_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  digest_str(digest_local.data,0x10,str,max_len);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void md5_str(MD5_DIGEST digest, char *str, size_t max_len)
{
	digest_str(digest.data, sizeof(digest.data), str, max_len);
}